

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::objectWarning(QPDFObjectHandle *this,string *warning)

{
  QPDF *qpdf;
  allocator<char> local_d9;
  QPDF *context;
  string description;
  string local_b0;
  QPDFExc local_90;
  
  context = (QPDF *)0x0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  description.field_2._M_local_buf[0] = '\0';
  QPDFObject::getDescription
            ((this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&context,&description);
  qpdf = context;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_d9);
  QPDFExc::QPDFExc(&local_90,qpdf_e_object,&local_b0,&description,0,warning);
  warn(qpdf,&local_90);
  QPDFExc::~QPDFExc(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
QPDFObjectHandle::objectWarning(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    // Type checks above guarantee that the object is initialized.
    obj->getDescription(context, description);
    // Null context handled by warn
    warn(context, QPDFExc(qpdf_e_object, "", description, 0, warning));
}